

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O3

void TemplateCacheUnittest::TestTemplateString(void)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  long lVar4;
  TemplateCache cache;
  TemplateDictionary dict;
  undefined1 local_118 [32];
  string local_f8;
  TemplateString local_d8 [2];
  TemplateString local_98 [3];
  
  ctemplate::TemplateCache::TemplateCache((TemplateCache *)local_d8);
  local_98[0].ptr_ = kKey.do_not_use_directly_.ptr_;
  local_98[0].length_ = kKey.do_not_use_directly_.length_;
  local_98[0].is_immutable_ = true;
  local_98[0].id_ = kKey.do_not_use_directly_.id_;
  local_118._0_8_ = kContent.do_not_use_directly_.ptr_;
  local_118._8_8_ = kContent.do_not_use_directly_.length_;
  local_118[0x10] = true;
  local_118._24_8_ = kContent.do_not_use_directly_.id_;
  cVar3 = ctemplate::TemplateCache::StringToTemplateCache(local_d8,local_98,(Strip)local_118);
  if (cVar3 == '\0') {
    printf("ASSERT FAILED, line %d: %s\n",0x3b3,
           "cache.StringToTemplateCache(kKey, kContent, DO_NOT_STRIP)");
    local_98[0].ptr_ = kKey.do_not_use_directly_.ptr_;
    local_98[0].length_ = kKey.do_not_use_directly_.length_;
    local_98[0].is_immutable_ = true;
    local_98[0].id_ = kKey.do_not_use_directly_.id_;
    local_118._0_8_ = kContent.do_not_use_directly_.ptr_;
    local_118._8_8_ = kContent.do_not_use_directly_.length_;
    local_118[0x10] = true;
    local_118._24_8_ = kContent.do_not_use_directly_.id_;
    cVar3 = ctemplate::TemplateCache::StringToTemplateCache(local_d8,local_98,(Strip)local_118);
    if (cVar3 == '\0') {
      __assert_fail("cache.StringToTemplateCache(kKey, kContent, DO_NOT_STRIP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3b3,"static void TemplateCacheUnittest::TestTemplateString()");
    }
  }
  else {
    local_98[0].ptr_ = kKey.do_not_use_directly_.ptr_;
    local_98[0].length_ = kKey.do_not_use_directly_.length_;
    local_98[0].is_immutable_ = true;
    local_98[0].id_ = kKey.do_not_use_directly_.id_;
    lVar4 = ctemplate::TemplateCache::GetTemplate(local_d8,(Strip)local_98);
    if (lVar4 == 0) {
      printf("ASSERT FAILED, line %d: %s\n",0x3b5,"tpl");
      __assert_fail("tpl",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3b5,"static void TemplateCacheUnittest::TestTemplateString()");
    }
    local_118._0_8_ = "dict";
    local_118._8_8_ = 4;
    local_118[0x10] = true;
    local_118._24_8_ = 0;
    ctemplate::TemplateDictionary::TemplateDictionary
              ((TemplateDictionary *)local_98,(TemplateString *)local_118,(UnsafeArena *)0x0);
    pcVar1 = local_118 + 0x10;
    local_118._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"MY_KEY","");
    paVar2 = &local_f8.field_2;
    local_f8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"content","");
    ctemplate::AssertExpandWithCacheIs
              ((TemplateCache *)local_d8,(string *)local_118,DO_NOT_STRIP,
               (TemplateDictionary *)local_98,(PerExpandData *)0x0,&local_f8,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((char *)local_118._0_8_ != pcVar1) {
      operator_delete((void *)local_118._0_8_);
    }
    local_118._0_8_ = "MY_KEY";
    local_118._8_8_ = 6;
    local_118[0x10] = true;
    local_118._24_8_ = 0;
    lVar4 = ctemplate::TemplateCache::GetTemplate(local_d8,(Strip)local_118);
    if (lVar4 == 0) {
      printf("ASSERT FAILED, line %d: %s\n",0x3bd,"tpl");
      __assert_fail("tpl",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3bd,"static void TemplateCacheUnittest::TestTemplateString()");
    }
    local_118._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"MY_KEY","");
    local_f8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"content","");
    ctemplate::AssertExpandWithCacheIs
              ((TemplateCache *)local_d8,(string *)local_118,DO_NOT_STRIP,
               (TemplateDictionary *)local_98,(PerExpandData *)0x0,&local_f8,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((char *)local_118._0_8_ != pcVar1) {
      operator_delete((void *)local_118._0_8_);
    }
    local_118._0_8_ = "MY_KEY";
    local_118._8_8_ = 6;
    local_118[0x10] = true;
    local_118._24_8_ = 0;
    ctemplate::TemplateCache::Delete(local_d8);
    local_118._0_8_ = "MY_KEY";
    local_118._8_8_ = 6;
    local_118[0x10] = true;
    local_118._24_8_ = 0;
    lVar4 = ctemplate::TemplateCache::GetTemplate(local_d8,(Strip)local_118);
    if (lVar4 != 0) {
      printf("ASSERT FAILED, line %d: %s\n",0x3c4,"!tpl");
      __assert_fail("!tpl",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3c4,"static void TemplateCacheUnittest::TestTemplateString()");
    }
    local_118._0_8_ = "MY_KEY";
    local_118._8_8_ = 6;
    local_118[0x10] = true;
    local_118._24_8_ = 0;
    local_f8._M_dataplus._M_p = "content";
    local_f8._M_string_length = 7;
    local_f8.field_2._M_local_buf[0] = '\x01';
    local_f8.field_2._8_8_ = 0;
    cVar3 = ctemplate::TemplateCache::StringToTemplateCache
                      (local_d8,(TemplateString *)local_118,(Strip)&local_f8);
    if (cVar3 != '\0') {
      local_118._0_8_ = kKey.do_not_use_directly_.ptr_;
      local_118._8_8_ = kKey.do_not_use_directly_.length_;
      local_118[0x10] = true;
      local_118._24_8_ = kKey.do_not_use_directly_.id_;
      lVar4 = ctemplate::TemplateCache::GetTemplate(local_d8,(Strip)local_118);
      if (lVar4 == 0) {
        printf("ASSERT FAILED, line %d: %s\n",0x3c8,"tpl");
        __assert_fail("tpl",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                      ,0x3c8,"static void TemplateCacheUnittest::TestTemplateString()");
      }
      local_118._0_8_ = kKey.do_not_use_directly_.ptr_;
      local_118._8_8_ = kKey.do_not_use_directly_.length_;
      local_118[0x10] = true;
      local_118._24_8_ = kKey.do_not_use_directly_.id_;
      ctemplate::TemplateCache::Delete(local_d8);
      local_118._0_8_ = "MY_KEY";
      local_118._8_8_ = 6;
      local_118[0x10] = true;
      local_118._24_8_ = 0;
      lVar4 = ctemplate::TemplateCache::GetTemplate(local_d8,(Strip)local_118);
      if (lVar4 == 0) {
        ctemplate::TemplateDictionary::~TemplateDictionary((TemplateDictionary *)local_98);
        ctemplate::TemplateCache::~TemplateCache((TemplateCache *)local_d8);
        return;
      }
      printf("ASSERT FAILED, line %d: %s\n",0x3cb,"!tpl");
      __assert_fail("!tpl",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3cb,"static void TemplateCacheUnittest::TestTemplateString()");
    }
    printf("ASSERT FAILED, line %d: %s\n",0x3c6,
           "cache.StringToTemplateCache(\"MY_KEY\", \"content\", DO_NOT_STRIP)");
    local_118._0_8_ = "MY_KEY";
    local_118._8_8_ = 6;
    local_118[0x10] = true;
    local_118._24_8_ = 0;
    local_f8._M_dataplus._M_p = "content";
    local_f8._M_string_length = 7;
    local_f8.field_2._M_local_buf[0] = '\x01';
    local_f8.field_2._8_8_ = 0;
    cVar3 = ctemplate::TemplateCache::StringToTemplateCache
                      (local_d8,(TemplateString *)local_118,(Strip)&local_f8);
    if (cVar3 == '\0') {
      __assert_fail("cache.StringToTemplateCache(\"MY_KEY\", \"content\", DO_NOT_STRIP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3c6,"static void TemplateCacheUnittest::TestTemplateString()");
    }
  }
  exit(1);
}

Assistant:

static void TestTemplateString() {
    TemplateCache cache;
    ASSERT(cache.StringToTemplateCache(kKey, kContent, DO_NOT_STRIP));
    const Template *tpl = cache.GetTemplate(kKey, DO_NOT_STRIP);
    ASSERT(tpl);

    TemplateDictionary dict("dict");
    AssertExpandWithCacheIs(&cache, "MY_KEY", DO_NOT_STRIP, &dict, NULL,
                            "content", true);

    // Try retrieving with a char* rather than a TemplateString*.
    tpl = cache.GetTemplate("MY_KEY", DO_NOT_STRIP);
    ASSERT(tpl);
    AssertExpandWithCacheIs(&cache, "MY_KEY", DO_NOT_STRIP, &dict, NULL,
                            "content", true);

    // Delete with a char* rather than a TemplateString*.
    cache.Delete("MY_KEY");
    tpl = cache.GetTemplate("MY_KEY", DO_NOT_STRIP);
    ASSERT(!tpl);

    ASSERT(cache.StringToTemplateCache("MY_KEY", "content", DO_NOT_STRIP));
    tpl = cache.GetTemplate(kKey, DO_NOT_STRIP);
    ASSERT(tpl);
    cache.Delete(kKey);
    tpl = cache.GetTemplate("MY_KEY", DO_NOT_STRIP);
    ASSERT(!tpl);
  }